

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopInvariantCodeMotion.cpp
# Opt level: O0

bool __thiscall
wasm::LoopInvariantCodeMotion::hasGetDependingOnLoopSet
          (LoopInvariantCodeMotion *this,Expression *curr,LoopSets *loopSets)

{
  bool bVar1;
  reference ppLVar2;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_00;
  value_type *ppLVar3;
  size_type sVar4;
  value_type local_c8;
  LocalSet *set;
  Iterator __end3;
  Iterator __begin3;
  Sets *__range3;
  Sets *sets;
  LocalGet *get;
  iterator __end2;
  iterator __begin2;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *__range2;
  FindAll<wasm::LocalGet> gets;
  LoopSets *loopSets_local;
  Expression *curr_local;
  LoopInvariantCodeMotion *this_local;
  
  gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)loopSets;
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)&__range2,curr);
  __end2 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin
                     ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&__range2);
  get = (LocalGet *)
        std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end
                  ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&__range2);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                                *)&get);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_01e40632:
      FindAll<wasm::LocalGet>::~FindAll((FindAll<wasm::LocalGet> *)&__range2);
      return this_local._7_1_;
    }
    ppLVar2 = __gnu_cxx::
              __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
              ::operator*(&__end2);
    this_00 = &LazyLocalGraph::getSets(this->localGraph,*ppLVar2)->
               super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ;
    SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ::begin((Iterator *)&__end3.flexibleIterator,this_00);
    SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ::end((Iterator *)&set,this_00);
    while (bVar1 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                   ::
                   IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                   ::operator!=((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                 *)&__end3.flexibleIterator,(Iterator *)&set), bVar1) {
      ppLVar3 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ::
                IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                ::operator*((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                             *)&__end3.flexibleIterator);
      local_c8 = *ppLVar3;
      if ((local_c8 != (value_type)0x0) &&
         (sVar4 = std::
                  unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                  ::count((unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                           *)gets.list.
                             super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c8),
         sVar4 != 0)) {
        this_local._7_1_ = true;
        goto LAB_01e40632;
      }
      SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
      ::
      IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
      ::operator++((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                    *)&__end3.flexibleIterator);
    }
    __gnu_cxx::
    __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool hasGetDependingOnLoopSet(Expression* curr, LoopSets& loopSets) {
    FindAll<LocalGet> gets(curr);
    for (auto* get : gets.list) {
      auto& sets = localGraph->getSets(get);
      for (auto* set : sets) {
        // nullptr means a parameter or zero-init value;
        // no danger to us.
        if (!set) {
          continue;
        }
        // Check if the set is in the loop. If not, it's either before,
        // which is fine, or after, which is also fine - moving curr
        // to just outside the loop will preserve those relationships.
        // TODO: this still counts curr's sets as inside the loop, which
        //       might matter in non-flat mode.
        if (loopSets.count(set)) {
          return true;
        }
      }
    }
    return false;
  }